

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O1

LispPTR N_OP_plus2(LispPTR tosm1,LispPTR tos)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  LispPTR LVar5;
  
  if ((tos & 0xfff0000) == 0xf0000) {
    uVar3 = tos | 0xffff0000;
  }
  else if ((tos & 0xfff0000) == 0xe0000) {
    uVar3 = tos & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(tos >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2)
    goto LAB_00106e9e;
    if ((tos & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)tos);
    }
    uVar3 = *(uint *)(Lisp_world + tos);
  }
  if ((tosm1 & 0xfff0000) == 0xf0000) {
    uVar2 = tosm1 | 0xffff0000;
  }
  else if ((tosm1 & 0xfff0000) == 0xe0000) {
    uVar2 = tosm1 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(tosm1 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
LAB_00106e9e:
      LVar5 = N_OP_fplus2(tosm1,tos);
      return LVar5;
    }
    if ((tosm1 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)tosm1);
    }
    uVar2 = *(uint *)(Lisp_world + tosm1);
  }
  uVar4 = uVar3 + uVar2;
  if (SCARRY4(uVar3,uVar2)) {
    MachineState.errorexit = 1;
    LVar5 = 0xffffffff;
    MachineState.tosvalue = tos;
  }
  else if ((uVar4 & 0xffff0000) == 0xffff0000) {
    LVar5 = uVar4 & 0xffff | 0xf0000;
  }
  else if ((uVar4 & 0xffff0000) == 0) {
    LVar5 = uVar4 | 0xe0000;
  }
  else {
    puVar1 = (uint *)createcell68k(2);
    *puVar1 = uVar4;
    if (((ulong)puVar1 & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",puVar1);
    }
    LVar5 = (LispPTR)((ulong)((long)puVar1 - (long)Lisp_world) >> 1);
  }
  return LVar5;
}

Assistant:

LispPTR N_OP_plus2(LispPTR tosm1, LispPTR tos) {
  int arg1, arg2;
  int result;

  N_GETNUMBER(tos, arg1, doufn);
  N_GETNUMBER(tosm1, arg2, doufn);

#ifdef USE_OVERFLOW_BUILTINS

  if (__builtin_sadd_overflow(arg1, arg2, &result)) {
    ERROR_EXIT(tos);
  }
  N_ARITH_SWITCH(result);

#else
  /* UB: signed integer overflow: 2147483647 + 2147483647 cannot be represented in type 'int' */
  result = arg1 + arg2;
  if (((arg1 >= 0) == (arg2 >= 0)) && ((result >= 0) != (arg1 >= 0))) { ERROR_EXIT(tos); }
  N_ARITH_SWITCH(result);

#endif

doufn:
  return (N_OP_fplus2(tosm1, tos));
}